

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O2

TPZContBufferedStream * __thiscall
TPZContBufferedStream::operator=(TPZContBufferedStream *this,TPZContBufferedStream *other)

{
  char *__src;
  size_t __n;
  char *pcVar1;
  char *__dest;
  size_t sVar2;
  
  sVar2 = other->fNAllocatedBytes;
  this->fNAllocatedBytes = sVar2;
  if (this->fBuffer != (char *)0x0) {
    operator_delete__(this->fBuffer);
    sVar2 = this->fNAllocatedBytes;
  }
  __dest = (char *)operator_new__(sVar2);
  this->fBuffer = __dest;
  __src = other->fBuffer;
  __n = other->fSize;
  memcpy(__dest,__src,__n);
  this->fSize = __n;
  pcVar1 = other->fFirst;
  this->fFirst = __dest + ((long)pcVar1 - (long)__src);
  this->fLast = __dest + ((long)pcVar1 - (long)__src) + (__n - 1);
  return this;
}

Assistant:

TPZContBufferedStream &TPZContBufferedStream::
        operator=(const TPZContBufferedStream &other) {
    fNAllocatedBytes = other.fNAllocatedBytes;
    if (fBuffer)
        delete[] fBuffer;
    fBuffer = new char[fNAllocatedBytes];
    memcpy(fBuffer, other.fBuffer, other.fSize);
    fSize = other.fSize;
    fFirst = fBuffer + (other.fFirst-other.fBuffer);
    fLast = fFirst - 1 + fSize;
    return *this;
}